

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O2

void SQCompilation::SQCompilationContext::vrenderDiagnosticHeader
               (DiagnosticsId diag,string *message,__va_list_tag *vargs)

{
  long lVar1;
  char tempBuffer [2048];
  char acStack_838 [2056];
  
  lVar1 = (ulong)diag * 0x28;
  memset(acStack_838,0,0x800);
  snprintf(acStack_838,0x800,"%s: ",
           *(undefined8 *)(severityNames + (ulong)*(uint *)(diagnosticDescriptors + lVar1 + 8) * 8))
  ;
  std::__cxx11::string::append((char *)message);
  if (0 < (int)*(uint *)(diagnosticDescriptors + lVar1 + 0x10)) {
    snprintf(acStack_838,0x800,"%c%d (%s) ",
             (ulong)(uint)(int)*(char *)((long)&severityPrefixes +
                                        (ulong)*(uint *)(diagnosticDescriptors + lVar1 + 8)),
             (ulong)*(uint *)(diagnosticDescriptors + lVar1 + 0x10),
             *(undefined8 *)(diagnosticDescriptors + lVar1 + 0x18));
    std::__cxx11::string::append((char *)message);
  }
  vsnprintf(acStack_838,0x800,*(char **)(diagnosticDescriptors + lVar1),vargs);
  std::__cxx11::string::append((char *)message);
  return;
}

Assistant:

void SQCompilationContext::vrenderDiagnosticHeader(enum DiagnosticsId diag, std::string &message, va_list vargs) {
  auto &desc = diagnosticDescriptors[diag];
  char tempBuffer[2048] = { 0 };

  snprintf(tempBuffer, sizeof tempBuffer, "%s: ", severityNames[desc.severity]);

  message.append(tempBuffer);

  if (desc.id > 0) {
    snprintf(tempBuffer, sizeof tempBuffer, "%c%d (%s) ", severityPrefixes[desc.severity], desc.id, desc.textId);
    message.append(tempBuffer);
  }

  vsnprintf(tempBuffer, sizeof tempBuffer, desc.format, vargs);

  message.append(tempBuffer);
}